

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

TimerHolder __thiscall Liby::TimerQueue::insert(TimerQueue *this,Timer *timer)

{
  bool bVar1;
  Logger *this_00;
  uint64_t uVar2;
  undefined8 *puVar3;
  Timestamp *timeout;
  Timer *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  double __x;
  TimerHolder TVar5;
  undefined1 local_70 [8];
  WeakTimerHolder weak_holder;
  Timer *timer_local;
  TimerQueue *this_local;
  TimerHolder *holder;
  
  this_00 = Logger::getLogger();
  Timer::id(in_RDX);
  Logger::log(this_00,__x);
  uVar2 = Timer::id(in_RDX);
  if (uVar2 != 0) {
    bVar1 = BinaryHeap<Liby::WeakTimerHolder>::empty
                      ((BinaryHeap<Liby::WeakTimerHolder> *)
                       &(timer->handler_).super__Function_base._M_manager);
    if (bVar1) {
      timeout = Timer::timeout(in_RDX);
      updateTimerfd((TimerQueue *)timer,timeout);
    }
    weak_holder.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._7_1_ = 0;
    TimerHolder::TimerHolder((TimerHolder *)this,in_RDX);
    WeakTimerHolder::WeakTimerHolder((WeakTimerHolder *)local_70,(TimerHolder *)this);
    BinaryHeap<Liby::WeakTimerHolder>::insert
              ((BinaryHeap<Liby::WeakTimerHolder> *)
               &(timer->handler_).super__Function_base._M_manager,(const_reference_type)local_70);
    weak_holder.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._7_1_ = 1;
    WeakTimerHolder::~WeakTimerHolder((WeakTimerHolder *)local_70);
    _Var4._M_pi = extraout_RDX;
    if ((weak_holder.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._7_1_ & 1) == 0) {
      TimerHolder::~TimerHolder((TimerHolder *)this);
      _Var4._M_pi = extraout_RDX_00;
    }
    TVar5.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    TVar5.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (TimerHolder)TVar5.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "timer id will not be zero";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

TimerHolder TimerQueue::insert(const Timer &timer) {
    verbose("add timer id = %lu", timer.id());
    if (timer.id() == 0) // ignore all timer which id is zero
        throw "timer id will not be zero";

    if (queue_.empty()) {
        updateTimerfd(timer.timeout());
    }

    TimerHolder holder(timer);
    WeakTimerHolder weak_holder(holder);
    queue_.insert(weak_holder);
    return holder;
}